

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObservation.cpp
# Opt level: O2

bool __thiscall test_CEObservation::test_constructor(test_CEObservation *this)

{
  CEObservation *other;
  undefined1 uVar1;
  CEBody *pCVar2;
  CEDate *pCVar3;
  CEObserver *pCVar4;
  CEBody *pCVar5;
  CEDate *pCVar6;
  CEObserver *pCVar7;
  CEObservation test4;
  CEObservation test3;
  CEObservation test2;
  CEObservation test1;
  allocator local_215;
  undefined4 local_214;
  undefined4 local_210 [8];
  CEObservation local_1f0;
  CEObservation local_180;
  CEObservation local_110;
  CEObservation local_a0;
  
  CEObservation::CEObservation(&local_a0);
  pCVar2 = CEObservation::Body(&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"test_constructor",(allocator *)&local_1f0);
  local_180._vptr_CEObservation._0_4_ = 0x5b;
  (**(code **)(*(long *)this + 0x48))(this,pCVar2 == (CEBody *)0x0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f0);
  pCVar3 = CEObservation::Date(&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"test_constructor",(allocator *)&local_1f0);
  local_180._vptr_CEObservation._0_4_ = 0x5c;
  (**(code **)(*(long *)this + 0x48))(this,pCVar3 == (CEDate *)0x0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f0);
  pCVar4 = CEObservation::Observer(&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"test_constructor",(allocator *)&local_1f0);
  local_180._vptr_CEObservation._0_4_ = 0x5d;
  (**(code **)(*(long *)this + 0x48))(this,pCVar4 == (CEObserver *)0x0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f0);
  other = &this->base_obs_;
  CEObservation::CEObservation(&local_110,other);
  pCVar2 = CEObservation::Body(&local_110);
  pCVar5 = CEObservation::Body(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"test_constructor",(allocator *)local_210);
  local_1f0._vptr_CEObservation._0_4_ = 0x61;
  (**(code **)(*(long *)this + 0x48))(this,pCVar2 == pCVar5,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_210);
  pCVar3 = CEObservation::Date(&local_110);
  pCVar6 = CEObservation::Date(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"test_constructor",(allocator *)local_210);
  local_1f0._vptr_CEObservation._0_4_ = 0x62;
  (**(code **)(*(long *)this + 0x48))(this,pCVar3 == pCVar6,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_210);
  pCVar4 = CEObservation::Observer(&local_110);
  pCVar7 = CEObservation::Observer(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"test_constructor",(allocator *)local_210);
  local_1f0._vptr_CEObservation._0_4_ = 99;
  (**(code **)(*(long *)this + 0x48))(this,pCVar4 == pCVar7,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_210);
  pCVar4 = &this->base_observer_;
  pCVar2 = &this->base_body_;
  pCVar3 = &this->base_date_;
  CEObservation::CEObservation(&local_180,pCVar4,pCVar2,pCVar3);
  pCVar5 = CEObservation::Body(&local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"test_constructor",(allocator *)&local_214);
  local_210[0] = 0x67;
  (**(code **)(*(long *)this + 0x48))(this,pCVar5 == pCVar2,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_214);
  pCVar6 = CEObservation::Date(&local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"test_constructor",(allocator *)&local_214);
  local_210[0] = 0x68;
  (**(code **)(*(long *)this + 0x48))(this,pCVar6 == pCVar3,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_214);
  pCVar7 = CEObservation::Observer(&local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"test_constructor",(allocator *)&local_214);
  local_210[0] = 0x69;
  (**(code **)(*(long *)this + 0x48))(this,pCVar7 == pCVar4,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_214);
  CEObservation::CEObservation(&local_1f0,&local_180);
  pCVar5 = CEObservation::Body(&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_210,"test_constructor",&local_215);
  local_214 = 0x6d;
  (**(code **)(*(long *)this + 0x48))(this,pCVar5 == pCVar2,local_210);
  std::__cxx11::string::~string((string *)local_210);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_215);
  pCVar6 = CEObservation::Date(&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_210,"test_constructor",&local_215);
  local_214 = 0x6e;
  (**(code **)(*(long *)this + 0x48))(this,pCVar6 == pCVar3,local_210);
  std::__cxx11::string::~string((string *)local_210);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_215);
  pCVar7 = CEObservation::Observer(&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_210,"test_constructor",&local_215);
  local_214 = 0x6f;
  (**(code **)(*(long *)this + 0x48))(this,pCVar7 == pCVar4,local_210);
  std::__cxx11::string::~string((string *)local_210);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_215);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CEObservation::~CEObservation(&local_1f0);
  CEObservation::~CEObservation(&local_180);
  CEObservation::~CEObservation(&local_110);
  CEObservation::~CEObservation(&local_a0);
  return (bool)uVar1;
}

Assistant:

bool test_CEObservation::test_constructor(void)
{
    // Default constructor
    CEObservation test1;
    test(test1.Body() == nullptr, __func__, __LINE__);
    test(test1.Date() == nullptr, __func__, __LINE__);
    test(test1.Observer() == nullptr, __func__, __LINE__);

    // Test the copy constructor
    CEObservation test2(base_obs_);
    test(test2.Body() == base_obs_.Body(), __func__, __LINE__);
    test(test2.Date() == base_obs_.Date(), __func__, __LINE__);
    test(test2.Observer() == base_obs_.Observer(), __func__, __LINE__);

    // Test construction from base objects
    CEObservation test3(&base_observer_, &base_body_, &base_date_);
    test(test3.Body() == &base_body_, __func__, __LINE__);
    test(test3.Date() == &base_date_, __func__, __LINE__);
    test(test3.Observer() == &base_observer_, __func__, __LINE__);

    // Test the copy assignment operator
    CEObservation test4 = test3;
    test(test4.Body() == &base_body_, __func__, __LINE__);
    test(test4.Date() == &base_date_, __func__, __LINE__);
    test(test4.Observer() == &base_observer_, __func__, __LINE__);

    return pass();
}